

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_echo_server.cpp
# Opt level: O2

void __thiscall echo_server::handle_timeout(echo_server *this,tcp_connection *conn)

{
  ostream *poVar1;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  endpoint ep;
  endpoint local_30 [16];
  
  local_30 = (endpoint  [16])ranger::event::tcp_connection::remote_endpoint();
  poVar1 = std::operator<<((ostream *)&std::cerr,"thread[");
  __id._M_thread = pthread_self();
  pbVar2 = std::operator<<(poVar1,__id);
  poVar1 = std::operator<<(pbVar2,"] ");
  poVar1 = std::operator<<(poVar1,"connection[");
  poVar1 = ranger::event::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"] ");
  poVar1 = std::operator<<(poVar1,"timeout.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Rb_tree<ranger::event::tcp_connection,_ranger::event::tcp_connection,_std::_Identity<ranger::event::tcp_connection>,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
  ::erase(&(this->m_conn_set)._M_t,conn);
  return;
}

Assistant:

void handle_timeout(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cerr << "thread[" << std::this_thread::get_id() << "] " << "connection[" << ep << "] " << "timeout." << std::endl;

		m_conn_set.erase(conn);
	}